

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O1

adios2_error adios2_engine_name(char *name,size_t *size,adios2_engine *engine)

{
  ulong uVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"for const adios2_engine, in call to adios2_engine_name","");
  adios2::helper::CheckForNullptr<adios2_engine_const>(engine,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"for size_t* size, in call to adios2_engine_name","");
  adios2::helper::CheckForNullptr<unsigned_long>(size,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar1 = *(ulong *)(engine + 0x38);
  *size = uVar1;
  if (name != (char *)0x0) {
    std::__cxx11::string::copy((char *)(engine + 0x30),(ulong)name,uVar1);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_name(char *name, size_t *size, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for const adios2_engine, in call to adios2_engine_name");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(size, "for size_t* size, in call to adios2_engine_name");

        return String2CAPI(engineCpp->m_Name, name, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_engine_name"));
    }
}